

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O2

void ssh1_got_user_input(ConnectionLayer *cl)

{
  size_t sVar1;
  ulong len;
  ptrlen pVar2;
  
  while( true ) {
    if (cl[-0xb].vt == (ConnectionLayerVtable *)0x0) {
      return;
    }
    sVar1 = bufchain_size((bufchain *)cl[-9].vt);
    if (sVar1 == 0) break;
    pVar2 = bufchain_prefix((bufchain *)cl[-9].vt);
    len = pVar2.len;
    if (0x1ff < len) {
      len = 0x200;
    }
    (*(code *)(cl[-0xc].logctx)->lgfp)(cl + -0xc,0,pVar2.ptr,len);
    bufchain_consume((bufchain *)cl[-9].vt,len);
  }
  return;
}

Assistant:

static void ssh1_got_user_input(ConnectionLayer *cl)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);

    while (s->mainchan && bufchain_size(s->user_input) > 0) {
        /*
         * Add user input to the main channel's buffer.
         */
        ptrlen data = bufchain_prefix(s->user_input);
        if (data.len > 512)
            data.len = 512;
        sshfwd_write(&s->mainchan_sc, data.ptr, data.len);
        bufchain_consume(s->user_input, data.len);
    }
}